

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O1

int set_definition(coda_product **product,coda_product_definition *definition)

{
  size_t __size;
  coda_format cVar1;
  coda_format format;
  coda_product *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long *plVar6;
  int64_t **ppiVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  
  cVar1 = (*product)->format;
  if (definition == (coda_product_definition *)0x0) {
    if (coda_format_binary < cVar1) {
      return 0;
    }
    coda_set_error(-200,(char *)0x0);
    return -1;
  }
  format = definition->format;
  if ((cVar1 != format) && (cVar1 != coda_format_binary || format != coda_format_ascii)) {
    pcVar4 = coda_type_get_format_name(format);
    pcVar5 = coda_type_get_format_name((*product)->format);
    coda_set_error(-200,"cannot use %s definition for %s product",pcVar4,pcVar5);
    return -1;
  }
  if ((definition->initialized == 0) &&
     (iVar3 = coda_read_product_definition(definition), iVar3 != 0)) {
    return -1;
  }
  cVar1 = definition->format;
  if (cVar1 == coda_format_xml) {
    iVar3 = coda_xml_reopen_with_definition(product,definition);
  }
  else if (cVar1 == coda_format_binary) {
    iVar3 = coda_bin_reopen_with_definition(product,definition);
  }
  else {
    if (cVar1 != coda_format_ascii) {
      (*product)->product_definition = definition;
      goto LAB_0014f9d9;
    }
    iVar3 = coda_ascii_reopen_with_definition(product,definition);
  }
  if (iVar3 != 0) {
    return -1;
  }
LAB_0014f9d9:
  pcVar2 = *product;
  lVar10 = (long)pcVar2->product_definition->num_product_variables;
  if (lVar10 < 1) {
    return 0;
  }
  __size = lVar10 * 8;
  plVar6 = (long *)malloc(__size);
  pcVar2->product_variable_size = plVar6;
  pcVar2 = *product;
  if (pcVar2->product_variable_size == (long *)0x0) {
    uVar9 = 0x1f1;
  }
  else {
    ppiVar7 = (int64_t **)malloc(__size);
    pcVar2->product_variable = ppiVar7;
    if ((*product)->product_variable != (int64_t **)0x0) {
      lVar8 = 0;
      do {
        (*product)->product_variable[lVar8] = (int64_t *)0x0;
        lVar8 = lVar8 + 1;
      } while (lVar10 != lVar8);
      return 0;
    }
    uVar9 = 0x1f8;
  }
  coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                 ,uVar9);
  return -1;
}

Assistant:

static int set_definition(coda_product **product, coda_product_definition *definition)
{
    if (definition == NULL)
    {
        if ((*product)->format == coda_format_binary || (*product)->format == coda_format_ascii)
        {
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, NULL);
            return -1;
        }
        /* if definition == NULL we have nothing to do */
        return 0;
    }

    if ((*product)->format != definition->format &&
        !((*product)->format == coda_format_binary && definition->format == coda_format_ascii))
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "cannot use %s definition for %s product",
                       coda_type_get_format_name(definition->format), coda_type_get_format_name((*product)->format));
        return -1;
    }

    if (!definition->initialized)
    {
        /* make sure that the root type and product variables of the product definition are initialized */
        if (coda_read_product_definition(definition) != 0)
        {
            return -1;
        }
    }

    /* unlike the coda_<backend>_reopen functions, the coda_<backend>_reopen_with_definition functions are _not_
     * responsible for closing the input product (even when errors occur)
     */
    switch (definition->format)
    {
        case coda_format_ascii:
            if (coda_ascii_reopen_with_definition(product, definition) != 0)
            {
                return -1;
            }
            break;
        case coda_format_binary:
            if (coda_bin_reopen_with_definition(product, definition) != 0)
            {
                return -1;
            }
            break;
        case coda_format_xml:
            if (coda_xml_reopen_with_definition(product, definition) != 0)
            {
                return -1;
            }
            break;
        default:
            /* self describing format */
            (*product)->product_definition = definition;
            break;
    }

    /* initialize product variables */
    if ((*product)->product_definition->num_product_variables > 0)
    {
        int num_product_variables;
        int i;

        num_product_variables = (*product)->product_definition->num_product_variables;
        (*product)->product_variable_size = malloc(num_product_variables * sizeof(long *));
        if ((*product)->product_variable_size == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           num_product_variables * sizeof(long *), __FILE__, __LINE__);
            return -1;
        }
        (*product)->product_variable = malloc(num_product_variables * sizeof(int64_t **));
        if ((*product)->product_variable == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           num_product_variables * sizeof(int64_t **), __FILE__, __LINE__);
            return -1;
        }

        for (i = 0; i < num_product_variables; i++)
        {
            (*product)->product_variable[i] = NULL;
        }
    }

    return 0;
}